

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

void Bus_ManStop(Bus_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Flt_t *pVVar1;
  
  __ptr = p->vFanouts;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vFanouts->pArray = (void **)0x0;
      __ptr = p->vFanouts;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_003de539;
    }
    free(__ptr);
    p->vFanouts = (Vec_Ptr_t *)0x0;
  }
LAB_003de539:
  pVVar1 = p->vWireCaps;
  if (pVVar1 != (Vec_Flt_t *)0x0) {
    if (pVVar1->pArray != (float *)0x0) {
      free(pVVar1->pArray);
      p->vWireCaps->pArray = (float *)0x0;
      pVVar1 = p->vWireCaps;
      if (pVVar1 == (Vec_Flt_t *)0x0) goto LAB_003de575;
    }
    free(pVVar1);
    p->vWireCaps = (Vec_Flt_t *)0x0;
  }
LAB_003de575:
  pVVar1 = p->vCins;
  if (pVVar1 != (Vec_Flt_t *)0x0) {
    if (pVVar1->pArray != (float *)0x0) {
      free(pVVar1->pArray);
      p->vCins->pArray = (float *)0x0;
      pVVar1 = p->vCins;
      if (pVVar1 == (Vec_Flt_t *)0x0) goto LAB_003de5b1;
    }
    free(pVVar1);
    p->vCins = (Vec_Flt_t *)0x0;
  }
LAB_003de5b1:
  pVVar1 = p->vETimes;
  if (pVVar1 != (Vec_Flt_t *)0x0) {
    if (pVVar1->pArray != (float *)0x0) {
      free(pVVar1->pArray);
      p->vETimes->pArray = (float *)0x0;
      pVVar1 = p->vETimes;
      if (pVVar1 == (Vec_Flt_t *)0x0) goto LAB_003de5ed;
    }
    free(pVVar1);
    p->vETimes = (Vec_Flt_t *)0x0;
  }
LAB_003de5ed:
  pVVar1 = p->vLoads;
  if (pVVar1 != (Vec_Flt_t *)0x0) {
    if (pVVar1->pArray != (float *)0x0) {
      free(pVVar1->pArray);
      p->vLoads->pArray = (float *)0x0;
      pVVar1 = p->vLoads;
      if (pVVar1 == (Vec_Flt_t *)0x0) goto LAB_003de629;
    }
    free(pVVar1);
    p->vLoads = (Vec_Flt_t *)0x0;
  }
LAB_003de629:
  pVVar1 = p->vDepts;
  if (pVVar1 != (Vec_Flt_t *)0x0) {
    if (pVVar1->pArray != (float *)0x0) {
      free(pVVar1->pArray);
      p->vDepts->pArray = (float *)0x0;
      pVVar1 = p->vDepts;
      if (pVVar1 == (Vec_Flt_t *)0x0) goto LAB_003de65d;
    }
    free(pVVar1);
  }
LAB_003de65d:
  free(p);
  return;
}

Assistant:

void Bus_ManStop( Bus_Man_t * p )
{
    Vec_PtrFreeP( &p->vFanouts );
    Vec_FltFreeP( &p->vWireCaps );
    Vec_FltFreeP( &p->vCins );
    Vec_FltFreeP( &p->vETimes );
    Vec_FltFreeP( &p->vLoads );
    Vec_FltFreeP( &p->vDepts );
    ABC_FREE( p );
}